

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::QueryGeometryInterleaved::createTransformFeedbackBuffer
          (QueryGeometryInterleaved *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  QueryGeometryInterleaved *this_local;
  
  pRVar2 = deqp::Context::getRenderContext
                     (*(Context **)
                       (&(this->super_CaptureGeometryInterleaved).field_0x78 +
                       (long)(this->super_CaptureGeometryInterleaved).
                             _vptr_CaptureGeometryInterleaved[-3]));
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  CaptureVertexInterleaved::createTransformFeedbackBuffer
            ((CaptureVertexInterleaved *)
             ((long)&(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved +
             (long)(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved[-3]));
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6e0))
            (1,&(this->super_CaptureGeometryInterleaved).field_0x8);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGenQueries call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xf5f);
  return;
}

Assistant:

void gl3cts::TransformFeedback::QueryGeometryInterleaved::createTransformFeedbackBuffer(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Create buffer object. */
	gl3cts::TransformFeedback::CaptureGeometryInterleaved::createTransformFeedbackBuffer();

	/* Create query object. */
	gl.genQueries(1, &m_query_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries call failed.");
}